

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PgHdr * pcacheFetchFinishWithInit(PCache *pCache,Pgno pgno,sqlite3_pcache_page *pPage)

{
  undefined8 *puVar1;
  PgHdr *pPVar2;
  
  puVar1 = (undefined8 *)pPage->pExtra;
  puVar1[8] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  *puVar1 = pPage;
  puVar1[1] = pPage->pBuf;
  puVar1[2] = puVar1 + 9;
  puVar1[9] = 0;
  puVar1[3] = pCache;
  *(Pgno *)(puVar1 + 6) = pgno;
  *(undefined2 *)((long)puVar1 + 0x34) = 1;
  pPVar2 = sqlite3PcacheFetchFinish(pCache,pgno,pPage);
  return pPVar2;
}

Assistant:

static SQLITE_NOINLINE PgHdr *pcacheFetchFinishWithInit(
  PCache *pCache,             /* Obtain the page from this cache */
  Pgno pgno,                  /* Page number obtained */
  sqlite3_pcache_page *pPage  /* Page obtained by prior PcacheFetch() call */
){
  PgHdr *pPgHdr;
  assert( pPage!=0 );
  pPgHdr = (PgHdr*)pPage->pExtra;
  assert( pPgHdr->pPage==0 );
  memset(&pPgHdr->pDirty, 0, sizeof(PgHdr) - offsetof(PgHdr,pDirty));
  pPgHdr->pPage = pPage;
  pPgHdr->pData = pPage->pBuf;
  pPgHdr->pExtra = (void *)&pPgHdr[1];
  memset(pPgHdr->pExtra, 0, 8);
  pPgHdr->pCache = pCache;
  pPgHdr->pgno = pgno;
  pPgHdr->flags = PGHDR_CLEAN;
  return sqlite3PcacheFetchFinish(pCache,pgno,pPage);
}